

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_to_proto.c
# Opt level: O0

google_protobuf_FieldDescriptorProto * fielddef_toproto(upb_ToProto_Context *ctx,upb_FieldDef *f)

{
  upb_FieldDef *puVar1;
  _Bool _Var2;
  uint32_t uVar3;
  upb_Label value;
  upb_FieldType uVar4;
  google_protobuf_Edition gVar5;
  upb_CType uVar6;
  google_protobuf_FieldDescriptorProto *pgVar7;
  char *pcVar8;
  upb_FileDef *puVar9;
  upb_EnumDef *e;
  upb_MessageDef *puVar10;
  google_protobuf_FieldOptions *pgVar11;
  google_protobuf_FieldOptions *dst;
  char *pb;
  size_t size;
  upb_OneofDef *o;
  upb_StringView local_70;
  upb_StringView local_60;
  upb_StringView local_50;
  upb_StringView local_40;
  upb_StringView local_30;
  google_protobuf_FieldDescriptorProto *local_20;
  google_protobuf_FieldDescriptorProto *proto;
  upb_FieldDef *f_local;
  upb_ToProto_Context *ctx_local;
  
  proto = (google_protobuf_FieldDescriptorProto *)f;
  f_local = (upb_FieldDef *)ctx;
  pgVar7 = google_protobuf_FieldDescriptorProto_new(ctx->arena);
  puVar1 = f_local;
  local_20 = pgVar7;
  if (pgVar7 == (google_protobuf_FieldDescriptorProto *)0x0) {
    longjmp((__jmp_buf_tag *)&f_local->resolved_features,1);
  }
  pcVar8 = upb_FieldDef_Name((upb_FieldDef *)proto);
  local_30 = strviewdup((upb_ToProto_Context *)puVar1,pcVar8);
  google_protobuf_FieldDescriptorProto_set_name(pgVar7,local_30);
  pgVar7 = local_20;
  uVar3 = upb_FieldDef_Number((upb_FieldDef *)proto);
  google_protobuf_FieldDescriptorProto_set_number(pgVar7,uVar3);
  _Var2 = upb_FieldDef_IsRequired((upb_FieldDef *)proto);
  if (_Var2) {
    puVar9 = upb_FieldDef_File((upb_FieldDef *)proto);
    gVar5 = upb_FileDef_Edition(puVar9);
    if (gVar5 < google_protobuf_EDITION_2023) goto LAB_0014bf1f;
    google_protobuf_FieldDescriptorProto_set_label(local_20,1);
  }
  else {
LAB_0014bf1f:
    pgVar7 = local_20;
    value = upb_FieldDef_Label((upb_FieldDef *)proto);
    google_protobuf_FieldDescriptorProto_set_label(pgVar7,value);
  }
  uVar4 = upb_FieldDef_Type((upb_FieldDef *)proto);
  if (uVar4 == kUpb_FieldType_Group) {
    puVar9 = upb_FieldDef_File((upb_FieldDef *)proto);
    gVar5 = upb_FileDef_Edition(puVar9);
    if (google_protobuf_EDITION_PROTO3 < gVar5) {
      google_protobuf_FieldDescriptorProto_set_type(local_20,0xb);
      goto LAB_0014bf99;
    }
  }
  pgVar7 = local_20;
  uVar4 = upb_FieldDef_Type((upb_FieldDef *)proto);
  google_protobuf_FieldDescriptorProto_set_type(pgVar7,uVar4);
LAB_0014bf99:
  _Var2 = upb_FieldDef_HasJsonName((upb_FieldDef *)proto);
  puVar1 = f_local;
  pgVar7 = local_20;
  if (_Var2) {
    pcVar8 = upb_FieldDef_JsonName((upb_FieldDef *)proto);
    local_40 = strviewdup((upb_ToProto_Context *)puVar1,pcVar8);
    google_protobuf_FieldDescriptorProto_set_json_name(pgVar7,local_40);
  }
  _Var2 = upb_FieldDef_IsSubMessage((upb_FieldDef *)proto);
  puVar1 = f_local;
  pgVar7 = local_20;
  if (_Var2) {
    puVar10 = upb_FieldDef_MessageSubDef((upb_FieldDef *)proto);
    pcVar8 = upb_MessageDef_FullName(puVar10);
    local_50 = qual_dup((upb_ToProto_Context *)puVar1,pcVar8);
    google_protobuf_FieldDescriptorProto_set_type_name(pgVar7,local_50);
  }
  else {
    uVar6 = upb_FieldDef_CType((upb_FieldDef *)proto);
    puVar1 = f_local;
    pgVar7 = local_20;
    if (uVar6 == kUpb_CType_Enum) {
      e = upb_FieldDef_EnumSubDef((upb_FieldDef *)proto);
      pcVar8 = upb_EnumDef_FullName(e);
      local_60 = qual_dup((upb_ToProto_Context *)puVar1,pcVar8);
      google_protobuf_FieldDescriptorProto_set_type_name(pgVar7,local_60);
    }
  }
  _Var2 = upb_FieldDef_IsExtension((upb_FieldDef *)proto);
  puVar1 = f_local;
  pgVar7 = local_20;
  if (_Var2) {
    puVar10 = upb_FieldDef_ContainingType((upb_FieldDef *)proto);
    pcVar8 = upb_MessageDef_FullName(puVar10);
    local_70 = qual_dup((upb_ToProto_Context *)puVar1,pcVar8);
    google_protobuf_FieldDescriptorProto_set_extendee(pgVar7,local_70);
  }
  _Var2 = upb_FieldDef_HasDefault((upb_FieldDef *)proto);
  pgVar7 = local_20;
  if (_Var2) {
    _o = default_string((upb_ToProto_Context *)f_local,(upb_FieldDef *)proto);
    google_protobuf_FieldDescriptorProto_set_default_value(pgVar7,_o);
  }
  size = (size_t)upb_FieldDef_ContainingOneof((upb_FieldDef *)proto);
  pgVar7 = local_20;
  if ((upb_OneofDef *)size != (upb_OneofDef *)0x0) {
    uVar3 = upb_OneofDef_Index((upb_OneofDef *)size);
    google_protobuf_FieldDescriptorProto_set_oneof_index(pgVar7,uVar3);
  }
  _Var2 = _upb_FieldDef_IsProto3Optional((upb_FieldDef *)proto);
  if (_Var2) {
    google_protobuf_FieldDescriptorProto_set_proto3_optional(local_20,true);
  }
  _Var2 = upb_FieldDef_HasOptions((upb_FieldDef *)proto);
  if (_Var2) {
    pgVar11 = upb_FieldDef_Options((upb_FieldDef *)proto);
    pcVar8 = google_protobuf_FieldOptions_serialize
                       (pgVar11,(upb_Arena *)f_local->opts,(size_t *)&pb);
    if (pcVar8 == (char *)0x0) {
      longjmp((__jmp_buf_tag *)&f_local->resolved_features,1);
    }
    pgVar11 = google_protobuf_FieldOptions_parse(pcVar8,(size_t)pb,(upb_Arena *)f_local->opts);
    if (pgVar11 == (google_protobuf_FieldOptions *)0x0) {
      longjmp((__jmp_buf_tag *)&f_local->resolved_features,1);
    }
    google_protobuf_FieldDescriptorProto_set_options(local_20,pgVar11);
  }
  return local_20;
}

Assistant:

static google_protobuf_FieldDescriptorProto* fielddef_toproto(upb_ToProto_Context* ctx,
                                                     const upb_FieldDef* f) {
  google_protobuf_FieldDescriptorProto* proto =
      google_protobuf_FieldDescriptorProto_new(ctx->arena);
  CHK_OOM(proto);

  google_protobuf_FieldDescriptorProto_set_name(proto,
                                       strviewdup(ctx, upb_FieldDef_Name(f)));
  google_protobuf_FieldDescriptorProto_set_number(proto, upb_FieldDef_Number(f));

  if (upb_FieldDef_IsRequired(f) &&
      upb_FileDef_Edition(upb_FieldDef_File(f)) >= UPB_DESC(EDITION_2023)) {
    google_protobuf_FieldDescriptorProto_set_label(
        proto, UPB_DESC(FieldDescriptorProto_LABEL_OPTIONAL));
  } else {
    google_protobuf_FieldDescriptorProto_set_label(proto, upb_FieldDef_Label(f));
  }
  if (upb_FieldDef_Type(f) == kUpb_FieldType_Group &&
      upb_FileDef_Edition(upb_FieldDef_File(f)) >= UPB_DESC(EDITION_2023)) {
    google_protobuf_FieldDescriptorProto_set_type(proto, kUpb_FieldType_Message);
  } else {
    google_protobuf_FieldDescriptorProto_set_type(proto, upb_FieldDef_Type(f));
  }

  if (upb_FieldDef_HasJsonName(f)) {
    google_protobuf_FieldDescriptorProto_set_json_name(
        proto, strviewdup(ctx, upb_FieldDef_JsonName(f)));
  }

  if (upb_FieldDef_IsSubMessage(f)) {
    google_protobuf_FieldDescriptorProto_set_type_name(
        proto,
        qual_dup(ctx, upb_MessageDef_FullName(upb_FieldDef_MessageSubDef(f))));
  } else if (upb_FieldDef_CType(f) == kUpb_CType_Enum) {
    google_protobuf_FieldDescriptorProto_set_type_name(
        proto, qual_dup(ctx, upb_EnumDef_FullName(upb_FieldDef_EnumSubDef(f))));
  }

  if (upb_FieldDef_IsExtension(f)) {
    google_protobuf_FieldDescriptorProto_set_extendee(
        proto,
        qual_dup(ctx, upb_MessageDef_FullName(upb_FieldDef_ContainingType(f))));
  }

  if (upb_FieldDef_HasDefault(f)) {
    google_protobuf_FieldDescriptorProto_set_default_value(proto,
                                                  default_string(ctx, f));
  }

  const upb_OneofDef* o = upb_FieldDef_ContainingOneof(f);
  if (o) {
    google_protobuf_FieldDescriptorProto_set_oneof_index(proto, upb_OneofDef_Index(o));
  }

  if (_upb_FieldDef_IsProto3Optional(f)) {
    google_protobuf_FieldDescriptorProto_set_proto3_optional(proto, true);
  }

  if (upb_FieldDef_HasOptions(f)) {
    SET_OPTIONS(proto, FieldDescriptorProto, FieldOptions,
                upb_FieldDef_Options(f));
  }

  return proto;
}